

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O1

UNormalizationCheckResult __thiscall
icu_63::ComposeNormalizer2::quickCheck
          (ComposeNormalizer2 *this,UnicodeString *s,UErrorCode *errorCode)

{
  ushort uVar1;
  int iVar2;
  char16_t *src;
  UNormalizationCheckResult qcResult;
  UNormalizationCheckResult local_c;
  
  if (U_ZERO_ERROR < *errorCode) {
    return UNORM_MAYBE;
  }
  uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      src = (s->fUnion).fFields.fArray;
    }
    else {
      src = (s->fUnion).fStackFields.fBuffer;
    }
  }
  else {
    src = (char16_t *)0x0;
  }
  if (src != (char16_t *)0x0) {
    local_c = UNORM_YES;
    if ((short)uVar1 < 0) {
      iVar2 = (s->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)(short)uVar1 >> 5;
    }
    Normalizer2Impl::composeQuickCheck
              ((this->super_Normalizer2WithImpl).impl,src,src + iVar2,this->onlyContiguous,&local_c)
    ;
    return local_c;
  }
  *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return UNORM_MAYBE;
}

Assistant:

virtual UNormalizationCheckResult
    quickCheck(const UnicodeString &s, UErrorCode &errorCode) const U_OVERRIDE {
        if(U_FAILURE(errorCode)) {
            return UNORM_MAYBE;
        }
        const UChar *sArray=s.getBuffer();
        if(sArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return UNORM_MAYBE;
        }
        UNormalizationCheckResult qcResult=UNORM_YES;
        impl.composeQuickCheck(sArray, sArray+s.length(), onlyContiguous, &qcResult);
        return qcResult;
    }